

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  PolicyID id;
  _Hash_node_base *p_Var7;
  pointer source;
  pointer source_00;
  undefined1 auStack_368 [4];
  PolicyStatus local_364;
  string local_360;
  long *local_340;
  long local_338;
  long local_330 [2];
  string dirs;
  ios_base local_2b0 [264];
  ostringstream w;
  ios_base local_138 [264];
  
  local_364 = GetPolicyStatus(this,CMP0019);
  if (local_364 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"INCLUDE_DIRECTORIES","");
    bVar2 = cmState::IsPropertyChained
                      (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,&dirs,DIRECTORY);
    pcVar4 = GetProperty(this,&dirs,bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    bVar2 = mightExpandVariablesCMP0019(pcVar4);
    if (bVar2) {
      std::__cxx11::string::string((string *)&dirs,pcVar4,(allocator *)&local_360);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if (local_364 == WARN) {
        iVar3 = std::__cxx11::string::compare((char *)&dirs);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)auStack_368 + (int)*(undefined8 *)(_w + -0x18) + 0x1c0);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"as\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        }
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"INCLUDE_DIRECTORIES","")
      ;
      SetProperty(this,&local_360,dirs._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var7 = (this->Targets)._M_h._M_before_begin._M_nxt;
    if (p_Var7 != (_Hash_node_base *)0x0) {
      do {
        if (*(int *)&p_Var7[0x61]._M_nxt != 7) {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"INCLUDE_DIRECTORIES","");
          pcVar4 = cmTarget::GetProperty((cmTarget *)(p_Var7 + 5),&dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
          bVar2 = mightExpandVariablesCMP0019(pcVar4);
          if (bVar2) {
            std::__cxx11::string::string((string *)&dirs,pcVar4,(allocator *)&local_360);
            ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
            if (local_364 == WARN) {
              iVar3 = std::__cxx11::string::compare((char *)&dirs);
              if (iVar3 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&w,"Evaluated target ",0x11);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&w,(char *)p_Var7[0x3a]._M_nxt,
                                    (long)p_Var7[0x3b]._M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," INCLUDE_DIRECTORIES\n",0x15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
                if (pcVar4 == (char *)0x0) {
                  std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar5 = strlen(pcVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"as\n",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,dirs._M_dataplus._M_p,dirs._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              }
            }
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_360,"INCLUDE_DIRECTORIES","");
            cmTarget::SetProperty((cmTarget *)(p_Var7 + 5),&local_360,dirs._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs._M_dataplus._M_p != &dirs.field_2) {
              operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
            }
          }
        }
        p_Var7 = p_Var7->_M_nxt;
      } while (p_Var7 != (_Hash_node_base *)0x0);
    }
    source = (this->LinkDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (source != (this->LinkDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar2 = mightExpandVariablesCMP0019((source->_M_dataplus)._M_p);
        if (bVar2) {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dirs,pcVar1,pcVar1 + source->_M_string_length);
          ExpandVariablesInString(this,source,true,true,false,(char *)0x0,-1,false,false);
          if (local_364 == WARN) {
            sVar5 = source->_M_string_length;
            if (sVar5 == dirs._M_string_length) {
              if (sVar5 != 0) {
                iVar3 = bcmp((source->_M_dataplus)._M_p,dirs._M_dataplus._M_p,sVar5);
                if (iVar3 != 0) goto LAB_002ce203;
              }
            }
            else {
LAB_002ce203:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated link directory\n",0x19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(source->_M_dataplus)._M_p,source->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
        }
        source = source + 1;
      } while (source != (this->LinkDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    source_00 = (this->LinkLibraries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (source_00 !=
        (this->LinkLibraries).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar2 = mightExpandVariablesCMP0019((source_00->first)._M_dataplus._M_p);
        if (bVar2) {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          pcVar1 = (source_00->first)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dirs,pcVar1,pcVar1 + (source_00->first)._M_string_length);
          ExpandVariablesInString(this,&source_00->first,true,true,false,(char *)0x0,-1,false,false)
          ;
          if (local_364 == WARN) {
            sVar5 = (source_00->first)._M_string_length;
            if (sVar5 == dirs._M_string_length) {
              if (sVar5 != 0) {
                iVar3 = bcmp((source_00->first)._M_dataplus._M_p,dirs._M_dataplus._M_p,sVar5);
                if (iVar3 != 0) goto LAB_002ce376;
              }
            }
            else {
LAB_002ce376:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated link library\n",0x17);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(source_00->first)._M_dataplus._M_p,
                                  (source_00->first)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
        }
        source_00 = source_00 + 1;
      } while (source_00 !=
               (this->LinkLibraries).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::stringbuf::str();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_360,(cmPolicies *)0x13,id);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&dirs,local_360._M_dataplus._M_p,local_360._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"The following variable evaluations were encountered:\n",0x35);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_340,local_338);
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if(pol != cmPolicies::OLD && pol != cmPolicies::WARN)
    {
    return;
    }
  std::ostringstream w;

  const char *includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if(mightExpandVariablesCMP0019(includeDirs))
    {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if(pol == cmPolicies::WARN && dirs != includeDirs)
      {
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); ++l)
    {
    cmTarget &t = l->second;
    if (t.GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if(mightExpandVariablesCMP0019(includeDirs))
      {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if(pol == cmPolicies::WARN && dirs != includeDirs)
        {
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
      }
    }

  for(std::vector<std::string>::iterator d = this->LinkDirectories.begin();
      d != this->LinkDirectories.end(); ++d)
    {
    if(mightExpandVariablesCMP0019(d->c_str()))
      {
      std::string orig = *d;
      this->ExpandVariablesInString(*d, true, true);
      if(pol == cmPolicies::WARN && *d != orig)
        {
        w << "Evaluated link directory\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << *d << "\n";
        }
      }
    }
  for(cmTarget::LinkLibraryVectorType::iterator l =
        this->LinkLibraries.begin();
      l != this->LinkLibraries.end(); ++l)
    {
    if(mightExpandVariablesCMP0019(l->first.c_str()))
      {
      std::string orig = l->first;
      this->ExpandVariablesInString(l->first, true, true);
      if(pol == cmPolicies::WARN && l->first != orig)
        {
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << l->first << "\n";
        }
      }
    }

  if(!w.str().empty())
    {
    std::ostringstream m;
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    this->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    }
}